

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

double __thiscall
ParserProbModelXML::GetPotential
          (ParserProbModelXML *this,string *var_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps,bool isUtility)

{
  xmlNodePtr pxVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  xmlNodePtr node;
  pointer ppVar5;
  string *in_RSI;
  byte in_R8B;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  double p_2;
  double p_1;
  double p;
  const_iterator it;
  string CPD_type;
  xmlNodePtr parent;
  int i;
  bool cpd_found;
  xmlNodePtr top;
  xmlNodeSetPtr var_nodeset;
  xmlXPathObjectPtr var_nodes;
  stringstream xpath_ss;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_00000338;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_00000340;
  xmlNodePtr in_stack_00000348;
  xmlNodePtr in_stack_00000350;
  ParserProbModelXML *in_stack_00000358;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  xmlNodePtr in_stack_fffffffffffffb38;
  xmlChar *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  string *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  char *in_stack_fffffffffffffb78;
  allocator<char> *__lhs;
  __type_conflict local_469;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 uVar8;
  allocator<char> local_2c9;
  string local_2c8 [32];
  _xmlNode *local_2a8;
  undefined1 local_299;
  byte local_251;
  string local_250 [32];
  int local_230;
  __type_conflict local_229;
  xmlNodePtr local_228;
  xmlNodeSetPtr local_220;
  undefined1 local_211;
  string local_1f0 [48];
  xmlXPathObjectPtr local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_ffffffffffffff60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_ffffffffffffff68;
  xmlNodePtr in_stack_ffffffffffffff70;
  ParserProbModelXML *in_stack_ffffffffffffff78;
  double local_8;
  undefined1 extraout_var [56];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"/ProbModelXML/ProbNet/Potentials/Potential");
  if ((in_R8B & 1) == 0) {
    poVar3 = std::operator<<(local_1a8,
                             "[@role=\'conditionalProbability\']/Variables/Variable[@timeSlice=\'1\' and contains(@name, \""
                            );
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::operator<<(poVar3,"\")]");
  }
  else {
    poVar3 = std::operator<<(local_1a8,"[@role=\'utility\']/UtilityVariable[starts-with(@name, \"");
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::operator<<(poVar3,"\")]/following-sibling::Variables/Variable");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  local_1c0 = GetNodesMatchingExpression
                        ((ParserProbModelXML *)
                         CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                         in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_1f0);
  if (local_1c0 == (xmlXPathObjectPtr)0x0) {
    local_211 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::operator+(in_stack_fffffffffffffb78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    EParse::EParse((EParse *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                   in_stack_fffffffffffffb68);
    local_211 = 0;
    __cxa_throw(uVar4,&EParse::typeinfo,EParse::~EParse);
  }
  local_220 = local_1c0->nodesetval;
  local_228 = *local_220->nodeTab;
  if ((in_R8B & 1) == 0) {
    local_229 = false;
    local_230 = 0;
    while( true ) {
      uVar8 = false;
      if ((local_229 & 1U) == 0) {
        uVar8 = local_230 < local_220->nodeNr;
      }
      if ((bool)uVar8 == false) break;
      pxVar1 = local_220->nodeTab[local_230];
      local_251 = 0;
      local_228 = pxVar1;
      node = (xmlNodePtr)xmlFirstElementChild(pxVar1->parent);
      local_469 = false;
      if (pxVar1 == node) {
        GetVariableName_abi_cxx11_
                  ((ParserProbModelXML *)CONCAT17(uVar8,in_stack_fffffffffffffba8),node);
        local_251 = 1;
        local_469 = std::operator==(in_stack_fffffffffffffb50,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48)
                                   );
      }
      local_229 = local_469;
      if ((local_251 & 1) != 0) {
        std::__cxx11::string::~string(local_250);
      }
      local_230 = local_230 + 1;
    }
    if ((local_229 & 1U) == 0) {
      local_299 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::operator+(in_stack_fffffffffffffb78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30);
      EParse::EParse((EParse *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                     in_stack_fffffffffffffb68);
      local_299 = 0;
      __cxa_throw(uVar4,&EParse::typeinfo,EParse::~EParse);
    }
  }
  local_2a8 = local_228->parent->parent;
  xmlGetProp(local_2a8,"type");
  __lhs = &local_2c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (char *)in_stack_fffffffffffffb68,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  auVar7._0_8_ = std::allocator<char>::~allocator(&local_2c9);
  auVar7._8_56_ = extraout_var;
  auVar6 = auVar7._0_16_;
  uVar8 = std::operator==(in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
  if ((bool)uVar8) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::find(in_stack_fffffffffffffb28,(key_type *)0xa85c95);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                           *)0xa85cb6);
    auVar6 = vcvtusi2sd_avx512f(auVar6,(ppVar5->second).second);
    local_8 = 1.0 / auVar6._0_8_;
    xmlXPathFreeObject(local_1c0);
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
    if (bVar2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      local_8 = QueryTable(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)0xa85ddb);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)0xa85de8);
      xmlXPathFreeObject(local_1c0);
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
      if (!bVar2) {
        uVar4 = __cxa_allocate_exception(0x28);
        std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar8,in_stack_fffffffffffffb70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30);
        EParse::EParse((EParse *)CONCAT17(uVar8,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
                      );
        __cxa_throw(uVar4,&EParse::typeinfo,EParse::~EParse);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      local_8 = QueryADD(in_stack_00000358,in_stack_00000350,in_stack_00000348,in_stack_00000340,
                         in_stack_00000338);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)0xa85f14);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)0xa85f21);
      xmlXPathFreeObject(local_1c0);
    }
  }
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_8;
}

Assistant:

double ParserProbModelXML::GetPotential(const std::string var_name,
                                        const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                        const std::map<std::string, std::pair<Index, Index> > t1_deps,
                                        const bool isUtility)
{
    stringstream xpath_ss;
    xmlXPathObjectPtr var_nodes;
    xpath_ss << "/ProbModelXML/ProbNet/Potentials/Potential";
    if(!isUtility)
    {
        xpath_ss << "[@role='conditionalProbability']/Variables/Variable[@timeSlice='1' and contains(@name, \"" 
                 << var_name << "\")]";
    }
    else
    {
        xpath_ss << "[@role='utility']/UtilityVariable[starts-with(@name, \"" 
                 << var_name << "\")]/following-sibling::Variables/Variable";
    }
    var_nodes = GetNodesMatchingExpression((xmlChar*) xpath_ss.str().c_str());
    if(var_nodes == NULL)
        throw EParse("Could not find CPD for variable " + var_name);

    xmlNodeSetPtr var_nodeset = var_nodes->nodesetval;
    xmlNodePtr top = var_nodeset->nodeTab[0];
    if(!isUtility)
    {
        bool cpd_found = false;
        for(int i = 0; !cpd_found && i < var_nodeset->nodeNr; i++)
        {
            top = var_nodeset->nodeTab[i];
            cpd_found = (top == xmlFirstElementChild(top->parent) &&
                         GetVariableName(top) == var_name); //this prevents possible partial matchings in the variable name
        }

        if(!cpd_found)
            throw EParse("Could not find CPD for variable " + var_name + "(empty potential)");
    }
    xmlNodePtr parent = top->parent->parent;
    string CPD_type = (char*) xmlGetProp(parent, (xmlChar*) "type"); //Potential
    if(CPD_type == "Uniform")
    {
        map<string, pair<Index, Index> >::const_iterator it = t1_deps.find(var_name);
        double p = 1.0/(it->second.second);
        if(DEBUG_PARSE)
        {
              cout << "Output: " << var_name << "=" << it->second.first << " | Input: Uniform | " << "p=" << p << endl;
        }
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else if(CPD_type == "Table")
    {
        double p = QueryTable(parent, t0_deps, t1_deps);
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else if(CPD_type == "Tree/ADD")
    {
        double p = QueryADD(parent, parent, t0_deps, t1_deps);
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else
    {
        throw EParse("CPD type \"" + CPD_type + "\" not supported.");
    }
}